

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O0

int sha3_shake_memory(int num,uchar *in,unsigned_long inlen,uchar *out,unsigned_long *outlen)

{
  long in_RCX;
  long in_RSI;
  long in_R8;
  int err;
  hash_state md;
  hash_state *in_stack_fffffffffffffe28;
  unsigned_long in_stack_fffffffffffffe48;
  uchar *in_stack_fffffffffffffe50;
  hash_state *in_stack_fffffffffffffe58;
  int local_4;
  
  if (in_RSI == 0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/sha3.c",0x125
           );
  }
  if (in_RCX == 0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/sha3.c",0x126
           );
  }
  if (in_R8 == 0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/sha3.c",0x127
           );
  }
  local_4 = sha3_shake_init(in_stack_fffffffffffffe28,0);
  if (((local_4 == 0) &&
      (local_4 = sha3_process(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                              in_stack_fffffffffffffe48), local_4 == 0)) &&
     (local_4 = sha3_shake_done(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                                in_stack_fffffffffffffe48), local_4 == 0)) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int sha3_shake_memory(int num, const unsigned char *in, unsigned long inlen, unsigned char *out, unsigned long *outlen)
{
   hash_state md;
   int err;
   LTC_ARGCHK(in  != NULL);
   LTC_ARGCHK(out != NULL);
   LTC_ARGCHK(outlen != NULL);
   if ((err = sha3_shake_init(&md, num))          != CRYPT_OK) return err;
   if ((err = sha3_shake_process(&md, in, inlen)) != CRYPT_OK) return err;
   if ((err = sha3_shake_done(&md, out, *outlen)) != CRYPT_OK) return err;
   return CRYPT_OK;
}